

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer.cc
# Opt level: O2

void __thiscall wabt::anon_unknown_1::BinaryWriter::EndSection(BinaryWriter *this)

{
  RelocSection *pRVar1;
  pointer pRVar2;
  Offset OVar3;
  Reloc *reloc;
  pointer pRVar4;
  
  if (this->last_section_leb_size_guess_ != 0) {
    OVar3 = WriteFixupU32Leb128Size
                      (this,this->last_section_offset_,this->last_section_leb_size_guess_,
                       "FIXUP section size");
    pRVar1 = this->current_reloc_section_;
    if (OVar3 != 0 && pRVar1 != (RelocSection *)0x0) {
      pRVar2 = (pRVar1->relocations).super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      for (pRVar4 = (pRVar1->relocations).
                    super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>._M_impl.
                    super__Vector_impl_data._M_start; pRVar4 != pRVar2; pRVar4 = pRVar4 + 1) {
        pRVar4->offset = pRVar4->offset + OVar3;
      }
    }
    this->last_section_leb_size_guess_ = 0;
    this->section_count_ = this->section_count_ + 1;
    return;
  }
  __assert_fail("last_section_leb_size_guess_ != 0",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/binary-writer.cc"
                ,0x110,"void wabt::(anonymous namespace)::BinaryWriter::EndSection()");
}

Assistant:

void BinaryWriter::EndSection() {
  assert(last_section_leb_size_guess_ != 0);
  Offset delta = WriteFixupU32Leb128Size(
      last_section_offset_, last_section_leb_size_guess_, "FIXUP section size");
  if (current_reloc_section_ && delta != 0) {
    for (Reloc& reloc : current_reloc_section_->relocations) {
      reloc.offset += delta;
    }
  }
  last_section_leb_size_guess_ = 0;
  section_count_++;
}